

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::AggregateMarking::Decode(AggregateMarking *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KUINT16 i;
  long lVar2;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x1f < KVar1) {
    KDataStream::Read(stream,&this->m_ui8AggregateMarkingCharacterSet);
    lVar2 = 0;
    do {
      KDataStream::Read(stream,this->m_sAggregateMarkingString + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x1f);
    this->m_sAggregateMarkingString[0x1f] = '\0';
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode","");
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void AggregateMarking::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < AGGREGATE_MARKING_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8AggregateMarkingCharacterSet;

    for( KUINT16 i = 0; i < 31; ++i )
    {
        stream >> m_sAggregateMarkingString[i];
    }
    m_sAggregateMarkingString[31] = 0;
}